

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O1

void __thiscall
MultiBodyInplaceSolverIslandCallback::processIsland
          (MultiBodyInplaceSolverIslandCallback *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifolds,int numManifolds,int islandId)

{
  uint uVar1;
  long *plVar2;
  btMultiBodyConstraint *pbVar3;
  btCollisionObject **ptr;
  btPersistentManifold **ptr_00;
  btTypedConstraint **ptr_01;
  btMultiBodyConstraint **ptr_02;
  int iVar4;
  int iVar5;
  btCollisionObject **ppbVar6;
  long lVar7;
  btPersistentManifold **ppbVar8;
  btTypedConstraint **ppbVar9;
  btMultiBodyConstraint **ppbVar10;
  long lVar11;
  int iVar12;
  btTypedConstraint **ppbVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar18;
  long local_68;
  
  if (islandId < 0) {
    (*(this->m_solver->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
      _vptr_btConstraintSolver[0xd])();
  }
  else {
    uVar1 = this->m_numConstraints;
    uVar15 = 0;
    if ((int)uVar1 < 1) {
      uVar17 = 0;
      ppbVar13 = (btTypedConstraint **)0x0;
    }
    else {
      ppbVar13 = this->m_sortedConstraints;
      uVar17 = 0;
      do {
        iVar5 = ((*ppbVar13)->m_rbA->super_btCollisionObject).m_islandTag1;
        if (iVar5 < 0) {
          iVar5 = ((*ppbVar13)->m_rbB->super_btCollisionObject).m_islandTag1;
        }
        if (iVar5 == islandId) goto LAB_001cc5b6;
        uVar17 = uVar17 + 1;
        ppbVar13 = ppbVar13 + 1;
      } while (uVar1 != uVar17);
      ppbVar13 = (btTypedConstraint **)0x0;
      uVar17 = (ulong)uVar1;
    }
LAB_001cc5b6:
    if ((int)uVar17 < (int)uVar1) {
      ppbVar9 = this->m_sortedConstraints + (uVar17 & 0xffffffff);
      uVar15 = 0;
      do {
        iVar5 = ((*ppbVar9)->m_rbA->super_btCollisionObject).m_islandTag1;
        if (iVar5 < 0) {
          iVar5 = ((*ppbVar9)->m_rbB->super_btCollisionObject).m_islandTag1;
        }
        uVar15 = (ulong)((int)uVar15 + (uint)(iVar5 == islandId));
        ppbVar9 = ppbVar9 + 1;
        uVar16 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar16;
      } while ((int)uVar16 < (int)uVar1);
    }
    uVar17 = 0;
    if (this->m_numMultiBodyConstraints < 1) {
      uVar14 = 0;
    }
    else {
      local_68 = 0;
      uVar14 = 0;
      do {
        plVar2 = *(long **)((long)this->m_multiBodySortedConstraints + local_68);
        iVar4 = (**(code **)(*plVar2 + 0x18))(plVar2);
        iVar5 = (**(code **)(*plVar2 + 0x20))(plVar2);
        if (-1 < iVar4) {
          iVar5 = iVar4;
        }
        if (iVar5 == islandId) {
          local_68 = local_68 + (long)this->m_multiBodySortedConstraints;
          goto LAB_001cc67c;
        }
        uVar14 = uVar14 + 1;
        local_68 = local_68 + 8;
      } while ((long)uVar14 < (long)this->m_numMultiBodyConstraints);
    }
    local_68 = 0;
LAB_001cc67c:
    uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if ((int)uVar14 < this->m_numMultiBodyConstraints) {
      uVar14 = uVar14 & 0xffffffff;
      uVar17 = 0;
      do {
        pbVar3 = this->m_multiBodySortedConstraints[uVar14];
        iVar4 = (*pbVar3->_vptr_btMultiBodyConstraint[3])(pbVar3);
        iVar5 = (*pbVar3->_vptr_btMultiBodyConstraint[4])(pbVar3);
        uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if (-1 < iVar4) {
          iVar5 = iVar4;
        }
        uVar17 = (ulong)((int)uVar17 + (uint)(iVar5 == islandId));
        uVar14 = uVar14 + 1;
      } while ((int)uVar14 < this->m_numMultiBodyConstraints);
    }
    if ((this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize < 2) {
      (*(this->m_solver->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
        _vptr_btConstraintSolver[3])
                (this->m_solver,bodies,(ulong)(uint)numBodies,manifolds,(ulong)(uint)numManifolds,
                 ppbVar13,CONCAT44(uVar18,(int)uVar15),this->m_solverInfo,this->m_debugDrawer,
                 this->m_dispatcher);
    }
    else {
      if (0 < numBodies) {
        uVar14 = 0;
        do {
          iVar5 = (this->m_bodies).m_size;
          iVar4 = (this->m_bodies).m_capacity;
          if (iVar5 == iVar4) {
            iVar12 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar12 = 1;
            }
            if (iVar4 < iVar12) {
              if (iVar12 == 0) {
                ppbVar6 = (btCollisionObject **)0x0;
              }
              else {
                ppbVar6 = (btCollisionObject **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
              }
              lVar7 = (long)(this->m_bodies).m_size;
              if (0 < lVar7) {
                lVar11 = 0;
                do {
                  ppbVar6[lVar11] = (this->m_bodies).m_data[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar7 != lVar11);
              }
              ptr = (this->m_bodies).m_data;
              if (ptr != (btCollisionObject **)0x0) {
                if ((this->m_bodies).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr);
                }
                (this->m_bodies).m_data = (btCollisionObject **)0x0;
              }
              (this->m_bodies).m_ownsMemory = true;
              (this->m_bodies).m_data = ppbVar6;
              (this->m_bodies).m_capacity = iVar12;
            }
          }
          iVar5 = (this->m_bodies).m_size;
          (this->m_bodies).m_data[iVar5] = bodies[uVar14];
          (this->m_bodies).m_size = iVar5 + 1;
          uVar14 = uVar14 + 1;
        } while (uVar14 != (uint)numBodies);
      }
      if (0 < numManifolds) {
        uVar14 = 0;
        do {
          iVar5 = (this->m_manifolds).m_size;
          iVar4 = (this->m_manifolds).m_capacity;
          if (iVar5 == iVar4) {
            iVar12 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar12 = 1;
            }
            if (iVar4 < iVar12) {
              if (iVar12 == 0) {
                ppbVar8 = (btPersistentManifold **)0x0;
              }
              else {
                ppbVar8 = (btPersistentManifold **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
              }
              lVar7 = (long)(this->m_manifolds).m_size;
              if (0 < lVar7) {
                lVar11 = 0;
                do {
                  ppbVar8[lVar11] = (this->m_manifolds).m_data[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar7 != lVar11);
              }
              ptr_00 = (this->m_manifolds).m_data;
              if (ptr_00 != (btPersistentManifold **)0x0) {
                if ((this->m_manifolds).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr_00);
                }
                (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
              }
              (this->m_manifolds).m_ownsMemory = true;
              (this->m_manifolds).m_data = ppbVar8;
              (this->m_manifolds).m_capacity = iVar12;
            }
          }
          iVar5 = (this->m_manifolds).m_size;
          (this->m_manifolds).m_data[iVar5] = manifolds[uVar14];
          (this->m_manifolds).m_size = iVar5 + 1;
          uVar14 = uVar14 + 1;
        } while (uVar14 != (uint)numManifolds);
      }
      if (0 < (int)uVar15) {
        uVar14 = 0;
        do {
          iVar5 = (this->m_constraints).m_size;
          iVar4 = (this->m_constraints).m_capacity;
          if (iVar5 == iVar4) {
            iVar12 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar12 = 1;
            }
            if (iVar4 < iVar12) {
              if (iVar12 == 0) {
                ppbVar9 = (btTypedConstraint **)0x0;
              }
              else {
                ppbVar9 = (btTypedConstraint **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
              }
              lVar7 = (long)(this->m_constraints).m_size;
              if (0 < lVar7) {
                lVar11 = 0;
                do {
                  ppbVar9[lVar11] = (this->m_constraints).m_data[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar7 != lVar11);
              }
              ptr_01 = (this->m_constraints).m_data;
              if (ptr_01 != (btTypedConstraint **)0x0) {
                if ((this->m_constraints).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr_01);
                }
                (this->m_constraints).m_data = (btTypedConstraint **)0x0;
              }
              (this->m_constraints).m_ownsMemory = true;
              (this->m_constraints).m_data = ppbVar9;
              (this->m_constraints).m_capacity = iVar12;
            }
          }
          iVar5 = (this->m_constraints).m_size;
          (this->m_constraints).m_data[iVar5] = ppbVar13[uVar14];
          (this->m_constraints).m_size = iVar5 + 1;
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar15);
      }
      if (0 < (int)uVar17) {
        uVar15 = 0;
        do {
          iVar5 = (this->m_multiBodyConstraints).m_size;
          iVar4 = (this->m_multiBodyConstraints).m_capacity;
          if (iVar5 == iVar4) {
            iVar12 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar12 = 1;
            }
            if (iVar4 < iVar12) {
              if (iVar12 == 0) {
                ppbVar10 = (btMultiBodyConstraint **)0x0;
              }
              else {
                ppbVar10 = (btMultiBodyConstraint **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
              }
              lVar7 = (long)(this->m_multiBodyConstraints).m_size;
              if (0 < lVar7) {
                lVar11 = 0;
                do {
                  ppbVar10[lVar11] = (this->m_multiBodyConstraints).m_data[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar7 != lVar11);
              }
              ptr_02 = (this->m_multiBodyConstraints).m_data;
              if (ptr_02 != (btMultiBodyConstraint **)0x0) {
                if ((this->m_multiBodyConstraints).m_ownsMemory == true) {
                  btAlignedFreeInternal(ptr_02);
                }
                (this->m_multiBodyConstraints).m_data = (btMultiBodyConstraint **)0x0;
              }
              (this->m_multiBodyConstraints).m_ownsMemory = true;
              (this->m_multiBodyConstraints).m_data = ppbVar10;
              (this->m_multiBodyConstraints).m_capacity = iVar12;
            }
          }
          iVar5 = (this->m_multiBodyConstraints).m_size;
          (this->m_multiBodyConstraints).m_data[iVar5] =
               *(btMultiBodyConstraint **)(local_68 + uVar15 * 8);
          (this->m_multiBodyConstraints).m_size = iVar5 + 1;
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar17);
      }
      if ((this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize <
          (this->m_manifolds).m_size + (this->m_constraints).m_size) {
        processConstraints(this);
        return;
      }
    }
  }
  return;
}

Assistant:

virtual	void	processIsland(btCollisionObject** bodies,int numBodies,btPersistentManifold**	manifolds,int numManifolds, int islandId)
	{
		if (islandId<0)
		{
			///we don't split islands, so all constraints/contact manifolds/bodies are passed into the solver regardless the island id
			m_solver->solveMultiBodyGroup( bodies,numBodies,manifolds, numManifolds,m_sortedConstraints, m_numConstraints, &m_multiBodySortedConstraints[0],m_numConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
		} else
		{
				//also add all non-contact constraints/joints for this island
			btTypedConstraint** startConstraint = 0;
			btMultiBodyConstraint** startMultiBodyConstraint = 0;

			int numCurConstraints = 0;
			int numCurMultiBodyConstraints = 0;

			int i;
			
			//find the first constraint for this island

			for (i=0;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId2(m_sortedConstraints[i]) == islandId)
				{
					startConstraint = &m_sortedConstraints[i];
					break;
				}
			}
			//count the number of constraints in this island
			for (;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId2(m_sortedConstraints[i]) == islandId)
				{
					numCurConstraints++;
				}
			}

			for (i=0;i<m_numMultiBodyConstraints;i++)
			{
				if (btGetMultiBodyConstraintIslandId(m_multiBodySortedConstraints[i]) == islandId)
				{
					
					startMultiBodyConstraint = &m_multiBodySortedConstraints[i];
					break;
				}
			}
			//count the number of multi body constraints in this island
			for (;i<m_numMultiBodyConstraints;i++)
			{
				if (btGetMultiBodyConstraintIslandId(m_multiBodySortedConstraints[i]) == islandId)
				{
					numCurMultiBodyConstraints++;
				}
			}

			if (m_solverInfo->m_minimumSolverBatchSize<=1)
			{
				m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,startConstraint,numCurConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
			} else
			{
				
				for (i=0;i<numBodies;i++)
					m_bodies.push_back(bodies[i]);
				for (i=0;i<numManifolds;i++)
					m_manifolds.push_back(manifolds[i]);
				for (i=0;i<numCurConstraints;i++)
					m_constraints.push_back(startConstraint[i]);
				
				for (i=0;i<numCurMultiBodyConstraints;i++)
					m_multiBodyConstraints.push_back(startMultiBodyConstraint[i]);
				
				if ((m_constraints.size()+m_manifolds.size())>m_solverInfo->m_minimumSolverBatchSize)
				{
					processConstraints();
				} else
				{
					//printf("deferred\n");
				}
			}
		}
	}